

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O0

void WriteF0(char *filename,int f0_length,double frame_period,double *temporal_positions,double *f0,
            int text_flag)

{
  FILE *pFVar1;
  FILE *fp_1;
  int i;
  FILE *fp;
  int text_flag_local;
  double *f0_local;
  double *temporal_positions_local;
  double frame_period_local;
  int f0_length_local;
  char *filename_local;
  
  if (text_flag == 1) {
    pFVar1 = fopen(filename,"w");
    if (pFVar1 == (FILE *)0x0) {
      printf("File cannot be opened.\n");
    }
    else {
      for (fp_1._4_4_ = 0; fp_1._4_4_ < f0_length; fp_1._4_4_ = fp_1._4_4_ + 1) {
        fprintf(pFVar1,"%.5f %.5f\r\n",temporal_positions[fp_1._4_4_],f0[fp_1._4_4_]);
      }
      fclose(pFVar1);
    }
  }
  else {
    pFVar1 = fopen(filename,"wb");
    if (pFVar1 == (FILE *)0x0) {
      printf("File cannot be opened.\n");
    }
    else {
      fwrite("F0  ",1,4,pFVar1);
      anon_unknown.dwarf_a0e1::WriteOneParameter((FILE *)pFVar1,"NOF ",(double)f0_length,4);
      anon_unknown.dwarf_a0e1::WriteOneParameter((FILE *)pFVar1,"FP  ",frame_period,8);
      fwrite(f0,8,(long)f0_length,pFVar1);
      fclose(pFVar1);
    }
  }
  return;
}

Assistant:

void WriteF0(const char *filename, int f0_length, double frame_period,
    const double *temporal_positions, const double *f0, int text_flag) {
  if (text_flag == 1) {
    FILE *fp = fopen(filename, "w");
    if (NULL == fp) {
      printf("File cannot be opened.\n");
      return;
    }
    for (int i = 0; i < f0_length; ++i)
      fprintf(fp, "%.5f %.5f\r\n", temporal_positions[i], f0[i]);
    fclose(fp);
  } else {
    FILE *fp = fopen(filename, "wb");
    if (NULL == fp) {
      printf("File cannot be opened.\n");
      return;
    }

    // Header
    fwrite("F0  ", 1, 4, fp);

    // Parameters
    WriteOneParameter(fp, "NOF ", f0_length, 4);
    WriteOneParameter(fp, "FP  ", frame_period, 8);

    // Data
    fwrite(f0, 8, f0_length, fp);
    fclose(fp);
  }
}